

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BgzfStream_p.cpp
# Opt level: O1

void __thiscall BamTools::Internal::BgzfStream::ReadBlock(BgzfStream *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint *puVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  int extraout_var_00;
  int extraout_var_01;
  size_t sVar5;
  BamException *pBVar6;
  ulong uVar7;
  string message;
  char header [18];
  size_t blockLength;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined4 local_68;
  uint uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  ushort local_58;
  size_t local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  iVar3 = (*this->m_device->_vptr_IBamIODevice[7])();
  iVar4 = (*this->m_device->_vptr_IBamIODevice[5])(this->m_device,&local_68,0x12);
  if (extraout_var_00 < 0) {
    paVar1 = &local_a8.field_2;
    local_a8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"device error: ","");
    (*this->m_device->_vptr_IBamIODevice[9])(&local_48);
    std::operator+(&local_88,&local_a8,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
    pBVar6 = (BamException *)__cxa_allocate_exception(0x28);
    local_a8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"BgzfStream::ReadBlock","");
    BamException::BamException(pBVar6,&local_a8,&local_88);
    __cxa_throw(pBVar6,&BamException::typeinfo,BamException::~BamException);
  }
  if (CONCAT44(extraout_var_00,iVar4) == 0x12) {
    if ((((((char)local_68 != '\x1f') || (local_68._1_1_ != -0x75)) || (local_68._2_1_ != '\b')) ||
        (((local_68 & 0x4000000) == 0 || (uStack_60._2_2_ != 6)))) ||
       (((char)uStack_5c != 'B' || ((uStack_5c._1_1_ != 'C' || (uStack_5c._2_2_ != 2)))))) {
      pBVar6 = (BamException *)__cxa_allocate_exception(0x28);
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_88,"BgzfStream::ReadBlock","");
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a8,"invalid block header contents","");
      BamException::BamException(pBVar6,&local_88,&local_a8);
      __cxa_throw(pBVar6,&BamException::typeinfo,BamException::~BamException);
    }
    uVar7 = (ulong)local_58;
    local_50 = uVar7 + 1;
    puVar2 = (uint *)(this->m_compressedBlock).Buffer;
    *(ushort *)(puVar2 + 4) = local_58;
    *puVar2 = local_68;
    puVar2[1] = uStack_64;
    puVar2[2] = uStack_60;
    puVar2[3] = uStack_5c;
    if (uVar7 < 0x11) {
      pBVar6 = (BamException *)__cxa_allocate_exception(0x28);
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_88,"BgzfStream::ReadBlock","");
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"invalid BSIZE","");
      BamException::BamException(pBVar6,&local_88,&local_a8);
      __cxa_throw(pBVar6,&BamException::typeinfo,BamException::~BamException);
    }
    iVar4 = (*this->m_device->_vptr_IBamIODevice[5])
                      (this->m_device,(this->m_compressedBlock).Buffer + 0x12,
                       uVar7 - 0x11 & 0xffffffff);
    if (extraout_var_01 < 0) {
      paVar1 = &local_a8.field_2;
      local_a8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"device error: ","");
      (*this->m_device->_vptr_IBamIODevice[9])(&local_48);
      std::operator+(&local_88,&local_a8,&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != paVar1) {
        operator_delete(local_a8._M_dataplus._M_p);
      }
      pBVar6 = (BamException *)__cxa_allocate_exception(0x28);
      local_a8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a8,"BgzfStream::ReadBlock","");
      BamException::BamException(pBVar6,&local_a8,&local_88);
      __cxa_throw(pBVar6,&BamException::typeinfo,BamException::~BamException);
    }
    if (CONCAT44(extraout_var_01,iVar4) != uVar7 - 0x11) {
      pBVar6 = (BamException *)__cxa_allocate_exception(0x28);
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_88,"BgzfStream::ReadBlock","");
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a8,"could not read data from block","");
      BamException::BamException(pBVar6,&local_88,&local_a8);
      __cxa_throw(pBVar6,&BamException::typeinfo,BamException::~BamException);
    }
    sVar5 = InflateBlock(this,&local_50);
    if (this->m_blockLength != 0) {
      this->m_blockOffset = 0;
    }
    this->m_blockAddress = CONCAT44(extraout_var,iVar3);
    this->m_blockLength = (int32_t)sVar5;
  }
  else {
    if (CONCAT44(extraout_var_00,iVar4) != 0) {
      pBVar6 = (BamException *)__cxa_allocate_exception(0x28);
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_88,"BgzfStream::ReadBlock","");
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a8,"invalid block header size","");
      BamException::BamException(pBVar6,&local_88,&local_a8);
      __cxa_throw(pBVar6,&BamException::typeinfo,BamException::~BamException);
    }
    this->m_blockLength = 0;
  }
  return;
}

Assistant:

void BgzfStream::ReadBlock()
{

    BT_ASSERT_X(m_device, "BgzfStream::ReadBlock() - trying to read from null IO device");

    // store block's starting address
    const int64_t blockAddress = m_device->Tell();

    // read block header from file
    char header[Constants::BGZF_BLOCK_HEADER_LENGTH];
    int64_t numBytesRead = m_device->Read(header, Constants::BGZF_BLOCK_HEADER_LENGTH);

    // check for device error
    if (numBytesRead < 0) {
        const std::string message = std::string("device error: ") + m_device->GetErrorString();
        throw BamException("BgzfStream::ReadBlock", message);
    }

    // if block header empty
    if (numBytesRead == 0) {
        m_blockLength = 0;
        return;
    }

    // if block header invalid size
    if (numBytesRead != static_cast<int8_t>(Constants::BGZF_BLOCK_HEADER_LENGTH)) {
        throw BamException("BgzfStream::ReadBlock", "invalid block header size");
    }

    // validate block header contents
    if (!BgzfStream::CheckBlockHeader(header)) {
        throw BamException("BgzfStream::ReadBlock", "invalid block header contents");
    }

    // copy header contents to compressed buffer
    const std::size_t blockLength = BamTools::UnpackUnsignedShort(&header[16]) + 1;
    std::memcpy(m_compressedBlock.Buffer, header, Constants::BGZF_BLOCK_HEADER_LENGTH);

    // read remainder of block
    if (blockLength < Constants::BGZF_BLOCK_HEADER_LENGTH) {
        throw BamException("BgzfStream::ReadBlock", "invalid BSIZE");
    }

    const std::size_t remaining = blockLength - Constants::BGZF_BLOCK_HEADER_LENGTH;
    numBytesRead =
        m_device->Read(&m_compressedBlock.Buffer[Constants::BGZF_BLOCK_HEADER_LENGTH], remaining);

    // check for device error
    if (numBytesRead < 0) {
        const std::string message = std::string("device error: ") + m_device->GetErrorString();
        throw BamException("BgzfStream::ReadBlock", message);
    }

    // check that we read in expected numBytes
    if (numBytesRead != static_cast<int64_t>(remaining)) {
        throw BamException("BgzfStream::ReadBlock", "could not read data from block");
    }

    // decompress block data
    const std::size_t newBlockLength = InflateBlock(blockLength);

    // update block data
    if (m_blockLength != 0) {
        m_blockOffset = 0;
    }
    m_blockAddress = blockAddress;
    m_blockLength = newBlockLength;
}